

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ciphers.c
# Opt level: O0

void warn_if_untested(EVP_CIPHER *ciph,void *provider)

{
  int iVar1;
  long lVar2;
  undefined8 uVar3;
  long in_RSI;
  undefined8 in_RDI;
  testcase *t;
  testcase *local_18;
  
  lVar2 = EVP_CIPHER_get0_provider(in_RDI);
  if (in_RSI == lVar2) {
    local_18 = testcases;
    while ((local_18->algname != (char *)0x0 &&
           (iVar1 = EVP_CIPHER_is_a(in_RDI,local_18->algname), iVar1 == 0))) {
      local_18 = local_18 + 1;
    }
    if (local_18->algname == (char *)0x0) {
      uVar3 = EVP_CIPHER_get0_name(in_RDI);
      printf("\x1b[1;35mCipher %s is untested!\x1b[m\n",uVar3);
    }
  }
  return;
}

Assistant:

void warn_if_untested(const EVP_CIPHER *ciph, void *provider)
{
    const struct testcase *t;

    /* ENGINE provided EVP_MDs have a NULL provider */
    if (provider != EVP_CIPHER_get0_provider(ciph))
        return;

    for (t = testcases; t->algname; t++)
        if (EVP_CIPHER_is_a(ciph, t->algname))
            break;
    if (!t->algname)
        printf(cMAGENT "Cipher %s is untested!" cNORM "\n", EVP_CIPHER_name(ciph));
}